

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::combineOr(OptimizeInstructions *this,Binary *curr)

{
  Expression *pEVar1;
  Const *pCVar2;
  OptimizeInstructions *pOVar3;
  bool bVar4;
  Id IVar5;
  uint uVar6;
  undefined7 extraout_var;
  Binary *curr_00;
  Expression *pEVar7;
  anon_union_16_5_9943fe1e_for_Literal_0 local_350;
  undefined1 local_340 [72];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_2f8;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_2c8;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_298;
  char local_260;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_240;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_210;
  Expression **local_1e0 [2];
  undefined1 local_1d0 [21];
  bool bStack_1bb;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1b8;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_188;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_158;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_128;
  bool local_f7;
  bool local_f5;
  bool local_f3;
  bool local_f1;
  bool local_f0;
  bool local_ee;
  bool local_ed;
  bool local_d8;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_d0;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_a0;
  Literal local_70;
  Const *local_58;
  OptimizeInstructions *local_50;
  Expression *local_48;
  Const *cx;
  Const *cy;
  
  if (curr->op != OrInt32) {
    __assert_fail("curr->op == OrInt32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xc5e,"Expression *wasm::OptimizeInstructions::combineOr(Binary *)");
  }
  pEVar7 = curr->left;
  local_50 = this;
  if ((((pEVar7->_id == BinaryId) && (pEVar1 = curr->right, pEVar1->_id == BinaryId)) &&
      (pEVar7[1]._id != pEVar1[1]._id)) &&
     (bVar4 = ExpressionAnalyzer::equal
                        ((Expression *)pEVar7[1].type.id,(Expression *)pEVar1[1].type.id), bVar4)) {
    bVar4 = ExpressionAnalyzer::equal(*(Expression **)(pEVar7 + 2),*(Expression **)(pEVar1 + 2));
    if (bVar4) {
      unique0x100009d7 = _bStack_1bb;
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)local_1e0,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,(Expression *)pEVar7[1].type.id);
      pOVar3 = local_50;
      uVar6 = 0;
      if (((local_f0 == false) && (local_188._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
         ((uVar6 = 0, local_d8 == false &&
          (local_128._M_impl.super__Rb_tree_header._M_node_count == 0)))) {
        if (((local_f7 == false) && (local_f5 == false)) &&
           ((local_f3 == false &&
            (((local_f1 == false && (local_ee == false)) && (bStack_1bb == false)))))) {
          uVar6 = 0;
          if ((local_ed == false) && (local_a0._M_impl.super__Rb_tree_header._M_node_count == 0)) {
            if (local_1d0[0x14] != false) goto LAB_007fba67;
            uVar6 = 0;
            if (local_d0._M_impl.super__Rb_tree_header._M_node_count == 0) {
              EffectAnalyzer::EffectAnalyzer
                        ((EffectAnalyzer *)&local_350.func,
                         &((local_50->
                           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                           ).super_Pass.runner)->options,
                         (local_50->
                         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                         ).
                         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .
                         super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .currModule,*(Expression **)(pEVar7 + 2));
              uVar6 = (uint)CONCAT71((int7)((ulong)pOVar3 >> 8),1);
              if (local_260 == '\0') {
                bVar4 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)&local_350.func);
                uVar6 = (uint)CONCAT71(extraout_var,bVar4);
              }
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree(&local_210);
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree(&local_240);
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree(&local_298);
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree(&local_2c8);
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree(&local_2f8);
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)(local_340 + 0x18));
              if ((matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)
                  local_340._0_8_ !=
                  (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_340._0_8_);
              }
              uVar6 = uVar6 ^ 1;
            }
          }
        }
        else {
LAB_007fba67:
          uVar6 = 0;
        }
      }
      cy = (Const *)CONCAT44(cy._4_4_,uVar6);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_a0);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_d0);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_128);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_158);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_188);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_1b8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._0_8_);
      }
      if ((((char)cy != '\0') && (pEVar7[1]._id == UnaryId)) && (pEVar1[1]._id == MemoryGrowId)) {
        pEVar7[1]._id = UnreachableId;
        return pEVar7;
      }
    }
  }
  curr_00 = (Binary *)curr->left;
  local_1d0._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  stack0xfffffffffffffe40 = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  if (((curr_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
       BinaryId) && (local_48 = curr_00->right, local_48->_id == ConstId)) {
    cy = (Const *)curr_00->left;
    local_1e0[0] = &local_48;
    Literal::Literal((Literal *)&local_350.func,(Literal *)(local_48 + 1));
    bVar4 = Match::Internal::
            Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
            ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                       *)local_1d0,
                      (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)
                      &local_350.func);
    Literal::~Literal((Literal *)&local_350.func);
    if (!bVar4) goto LAB_007fbc45;
    pEVar7 = curr->right;
    local_340._0_8_ =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_340._16_8_ = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    local_350.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&cx;
    if ((pEVar7->_id != BinaryId) ||
       (pCVar2 = *(Const **)(pEVar7 + 2),
       (pCVar2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id != ConstId)
       ) goto LAB_007fbc45;
    local_58 = (Const *)pEVar7[1].type.id;
    cx = pCVar2;
    Literal::Literal(&local_70,&pCVar2->value);
    bVar4 = Match::Internal::
            Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
            ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                       *)local_340,&local_70);
    Literal::~Literal(&local_70);
    if ((!bVar4) ||
       ((((curr_00->op != pEVar7[1]._id ||
          ((cy->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id !=
           (local_58->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id))
         || (bVar4 = Literal::operator==((Literal *)(local_48 + 1),&cx->value), !bVar4)) ||
        (bVar4 = inversesOr(local_50,curr_00), pCVar2 = cy, !bVar4)))) goto LAB_007fbc45;
    IVar5 = Abstract::getBinary((Type)(cy->super_SpecificExpression<(wasm::Expression::Id)14>).
                                      super_Expression.type.id,And);
    pEVar7[1]._id = IVar5;
    (pEVar7->type).id =
         (pCVar2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id;
    pEVar7[1].type.id = (uintptr_t)pCVar2;
LAB_007fbd93:
    *(Const **)(pEVar7 + 2) = local_58;
    curr_00->left = pEVar7;
  }
  else {
LAB_007fbc45:
    curr_00 = (Binary *)curr->left;
    local_1d0._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    stack0xfffffffffffffe40 = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    if (((curr_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
         BinaryId) && (local_48 = curr_00->right, local_48->_id == ConstId)) {
      pEVar1 = curr_00->left;
      local_1e0[0] = &local_48;
      Literal::Literal((Literal *)&local_350.func,(Literal *)(local_48 + 1));
      bVar4 = Match::Internal::
              Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
              ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                         *)local_1d0,
                        (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_>
                         *)&local_350.func);
      Literal::~Literal((Literal *)&local_350.func);
      if (bVar4) {
        pEVar7 = curr->right;
        local_340._0_8_ =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
        local_340._16_8_ = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
        local_350.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&cx;
        if ((pEVar7->_id == BinaryId) &&
           (cx = *(Const **)(pEVar7 + 2),
           (cx->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id == ConstId)
           ) {
          cy = (Const *)pEVar7[1].type.id;
          Literal::Literal(&local_70,&cx->value);
          bVar4 = Match::Internal::
                  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                  ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                             *)local_340,&local_70);
          Literal::~Literal(&local_70);
          if (((bVar4) &&
              (((curr_00->op == pEVar7[1]._id &&
                ((pEVar1->type).id ==
                 (cy->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id))
               && (bVar4 = Literal::operator==((Literal *)(local_48 + 1),&cx->value), bVar4)))) &&
             (bVar4 = preserveOr(local_50,curr_00), bVar4)) {
            IVar5 = Abstract::getBinary((Type)(pEVar1->type).id,Or);
            pEVar7[1]._id = IVar5;
            (pEVar7->type).id = (pEVar1->type).id;
            pEVar7[1].type.id = (uintptr_t)pEVar1;
            local_58 = cy;
            goto LAB_007fbd93;
          }
        }
      }
    }
    curr_00 = (Binary *)0x0;
  }
  return (Expression *)curr_00;
}

Assistant:

Expression* combineOr(Binary* curr) {
    assert(curr->op == OrInt32);

    using namespace Abstract;
    using namespace Match;

    if (auto* left = curr->left->dynCast<Binary>()) {
      if (auto* right = curr->right->dynCast<Binary>()) {
        if (left->op != right->op &&
            ExpressionAnalyzer::equal(left->left, right->left) &&
            ExpressionAnalyzer::equal(left->right, right->right) &&
            !effects(left->left).hasSideEffects() &&
            !effects(left->right).hasSideEffects()) {
          switch (left->op) {
            //   (x > y) | (x == y)    ==>    x >= y
            case EqInt32: {
              if (right->op == GtSInt32) {
                left->op = GeSInt32;
                return left;
              }
              break;
            }
            default: {
            }
          }
        }
      }
    }
    {
      // Binary operations that inverses a bitwise OR to AND.
      // If F(x) = binary(x, c), and F(x) inverses OR,
      // that is,
      //
      //   F(x) | F(y) == F(x & y)
      //
      // Then also
      //
      //   binary(x, c) | binary(y, c)  =>  binary(x & y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          inversesOr(bx)) {
        by->op = getBinary(x->type, And);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    {
      // Binary operations that preserve a bitwise OR can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves OR,
      // that is,
      //
      //   F(x) | F(y) == F(x | y)
      //
      // Then also
      //
      //   binary(x, c) | binary(y, c)  =>  binary(x | y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          preserveOr(bx)) {
        by->op = getBinary(x->type, Or);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    return nullptr;
  }